

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

dict_t * dict_init(ps_config_t *config,bin_mdef_t *mdef)

{
  bin_mdef_t *pbVar1;
  int iVar2;
  int32 iVar3;
  char *__filename;
  char *pcVar4;
  lineiter_t *plVar5;
  dict_t *d;
  dictword_t *pdVar6;
  bin_mdef_t *pbVar7;
  hash_table_t *phVar8;
  s3wid_t sVar9;
  long ln;
  FILE *__stream;
  uint uVar10;
  FILE *__stream_00;
  uint uVar11;
  int32 w;
  int local_60;
  s3cipid_t local_5a;
  FILE *local_58;
  char *local_50;
  char *local_48;
  FILE *local_40;
  bin_mdef_t *local_38;
  
  uVar11 = 0;
  local_38 = mdef;
  if (config == (ps_config_t *)0x0) {
    __filename = (char *)0x0;
    pcVar4 = (char *)0x0;
  }
  else {
    __filename = ps_config_str(config,"dict");
    pcVar4 = ps_config_str(config,"fdict");
  }
  local_48 = __filename;
  if (__filename == (char *)0x0) {
    __stream_00 = (FILE *)0x0;
  }
  else {
    local_58 = fopen(__filename,"r");
    if (local_58 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                     ,0x111,"Failed to open dictionary file \'%s\' for reading",__filename);
      return (dict_t *)0x0;
    }
    local_50 = pcVar4;
    plVar5 = lineiter_start((FILE *)local_58);
    if (plVar5 == (lineiter_t *)0x0) {
      uVar11 = 0;
    }
    else {
      uVar11 = 0;
      do {
        pcVar4 = plVar5->buf;
        iVar2 = strncmp(pcVar4,"##",2);
        if (iVar2 != 0) {
          iVar2 = strncmp(pcVar4,";;",2);
          uVar11 = (uVar11 + 1) - (uint)(iVar2 == 0);
        }
        plVar5 = lineiter_next(plVar5);
      } while (plVar5 != (lineiter_t *)0x0);
    }
    __stream_00 = local_58;
    fseek(local_58,0,0);
    pcVar4 = local_50;
  }
  if (pcVar4 == (char *)0x0) {
    __stream = (FILE *)0x0;
  }
  else {
    local_40 = fopen(pcVar4,"r");
    if (local_40 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                     ,0x11f,"Failed to open filler dictionary file \'%s\' for reading",pcVar4);
      fclose(__stream_00);
      return (dict_t *)0x0;
    }
    local_58 = __stream_00;
    local_50 = pcVar4;
    plVar5 = lineiter_start((FILE *)local_40);
    __stream = local_40;
    while (local_40 = __stream, plVar5 != (lineiter_t *)0x0) {
      pcVar4 = plVar5->buf;
      iVar2 = strncmp(pcVar4,"##",2);
      if (iVar2 != 0) {
        iVar2 = strncmp(pcVar4,";;",2);
        uVar11 = (uVar11 + 1) - (uint)(iVar2 == 0);
      }
      plVar5 = lineiter_next(plVar5);
      __stream = local_40;
    }
    fseek(__stream,0,0);
    pcVar4 = local_50;
    __stream_00 = local_58;
  }
  d = (dict_t *)
      __ckd_calloc__(1,0x40,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                     ,0x12f);
  uVar10 = 0x7fffeffe;
  if ((int)uVar11 < 0x7fffeffe) {
    uVar10 = uVar11;
  }
  d->refcnt = 1;
  uVar10 = uVar10 + 0x1000;
  d->max_words = uVar10;
  if (0x7ffffffd < (int)uVar11) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x135,"Number of words in dictionaries (%d) exceeds limit (%d)\n",(ulong)uVar11,
            0x7ffffffe);
    if (__stream_00 != (FILE *)0x0) {
      fclose(__stream_00);
    }
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    ckd_free(d);
    return (dict_t *)0x0;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
          0x13e,"Allocating %d * %d bytes (%d KiB) for word entries\n",(ulong)uVar10,0x20,
          (ulong)(long)(int)uVar10 >> 5 & 0x3fffffffffffff);
  pdVar6 = (dictword_t *)
           __ckd_calloc__((long)d->max_words,0x20,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                          ,0x13f);
  pbVar1 = local_38;
  d->word = pdVar6;
  d->n_word = 0;
  if (local_38 != (bin_mdef_t *)0x0) {
    pbVar7 = bin_mdef_retain(local_38);
    d->mdef = pbVar7;
  }
  if (config != (ps_config_t *)0x0) {
    iVar2 = ps_config_bool(config,"dictcase");
    d->nocase = iVar2;
  }
  phVar8 = hash_table_new(d->max_words,d->nocase);
  d->ht = phVar8;
  if (__stream_00 != (FILE *)0x0) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x14b,"Reading main dictionary: %s\n",local_48);
    dict_read((FILE *)__stream_00,d);
    fclose(__stream_00);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x14e,"%d words read\n",(ulong)(uint)d->n_word);
  }
  iVar3 = hash_table_lookup_int32(d->ht,"<s>",&local_60);
  if ((iVar3 < 0) || (local_60 == -1)) {
    iVar3 = hash_table_lookup_int32(d->ht,"</s>",&local_60);
    if ((iVar3 < 0) || (local_60 == -1)) {
      iVar3 = hash_table_lookup_int32(d->ht,"<sil>",&local_60);
      if ((iVar3 < 0) || (local_60 == -1)) {
        d->filler_start = d->n_word;
        if (__stream != (FILE *)0x0) {
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x164,"Reading filler dictionary: %s\n",pcVar4);
          dict_read((FILE *)__stream,d);
          fclose(__stream);
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x167,"%d words read\n",(ulong)(uint)(d->n_word - d->filler_start));
        }
        if (pbVar1 == (bin_mdef_t *)0x0) {
          local_5a = 0;
        }
        else {
          local_5a = (s3cipid_t)pbVar1->sil;
        }
        iVar3 = hash_table_lookup_int32(d->ht,"<s>",&local_60);
        if ((iVar3 < 0) || (local_60 == -1)) {
          dict_add_word(d,"<s>",&local_5a,1);
        }
        iVar3 = hash_table_lookup_int32(d->ht,"</s>",&local_60);
        if ((iVar3 < 0) || (local_60 == -1)) {
          dict_add_word(d,"</s>",&local_5a,1);
        }
        iVar3 = hash_table_lookup_int32(d->ht,"<sil>",&local_60);
        if ((iVar3 < 0) || (local_60 == -1)) {
          dict_add_word(d,"<sil>",&local_5a,1);
        }
        d->filler_end = d->n_word + -1;
        iVar3 = hash_table_lookup_int32(d->ht,"<s>",&local_60);
        sVar9 = -1;
        if (-1 < iVar3) {
          sVar9 = local_60;
        }
        d->startwid = sVar9;
        iVar3 = hash_table_lookup_int32(d->ht,"</s>",&local_60);
        sVar9 = -1;
        if (-1 < iVar3) {
          sVar9 = local_60;
        }
        d->finishwid = sVar9;
        iVar3 = hash_table_lookup_int32(d->ht,"<sil>",&local_60);
        sVar9 = -1;
        if (-1 < iVar3) {
          sVar9 = local_60;
        }
        d->silwid = sVar9;
        if ((d->filler_start <= d->filler_end) && (iVar2 = dict_filler_word(d,sVar9), iVar2 != 0)) {
          return d;
        }
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0x181,"Word \'%s\' must occur (only) in filler dictionary\n","<sil>");
        goto LAB_00123757;
      }
      pcVar4 = "Remove silence word \'<sil>\' from the dictionary\n";
      ln = 0x15c;
    }
    else {
      pcVar4 = "Remove sentence start word \'</s>\' from the dictionary\n";
      ln = 0x157;
    }
  }
  else {
    pcVar4 = "Remove sentence start word \'<s>\' from the dictionary\n";
    ln = 0x152;
  }
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",ln
          ,pcVar4);
LAB_00123757:
  dict_free(d);
  return (dict_t *)0x0;
}

Assistant:

dict_t *
dict_init(ps_config_t *config, bin_mdef_t * mdef)
{
    FILE *fp, *fp2;
    int32 n;
    lineiter_t *li;
    dict_t *d;
    s3cipid_t sil;
    char const *dictfile = NULL, *fillerfile = NULL;

    if (config) {
        dictfile = ps_config_str(config, "dict");
        fillerfile = ps_config_str(config, "fdict");
    }

    /*
     * First obtain #words in dictionary (for hash table allocation).
     * Reason: The PC NT system doesn't like to grow memory gradually.  Better to allocate
     * all the required memory in one go.
     */
    fp = NULL;
    n = 0;
    if (dictfile) {
        if ((fp = fopen(dictfile, "r")) == NULL) {
            E_ERROR_SYSTEM("Failed to open dictionary file '%s' for reading", dictfile);
            return NULL;
        }
        for (li = lineiter_start(fp); li; li = lineiter_next(li)) {
            if (0 != strncmp(li->buf, "##", 2)
                && 0 != strncmp(li->buf, ";;", 2))
                n++;
        }
	fseek(fp, 0L, SEEK_SET);
    }

    fp2 = NULL;
    if (fillerfile) {
        if ((fp2 = fopen(fillerfile, "r")) == NULL) {
            E_ERROR_SYSTEM("Failed to open filler dictionary file '%s' for reading", fillerfile);
            fclose(fp);
            return NULL;
	}
        for (li = lineiter_start(fp2); li; li = lineiter_next(li)) {
	    if (0 != strncmp(li->buf, "##", 2)
    	        && 0 != strncmp(li->buf, ";;", 2))
                n++;
        }
        fseek(fp2, 0L, SEEK_SET);
    }

    /*
     * Allocate dict entries.  HACK!!  Allow some extra entries for words not in file.
     * Also check for type size restrictions.
     */
    d = (dict_t *) ckd_calloc(1, sizeof(dict_t));       /* freed in dict_free() */
    d->refcnt = 1;
    d->max_words =
        (n + S3DICT_INC_SZ < MAX_S3WID) ? n + S3DICT_INC_SZ : MAX_S3WID;
    if (n >= MAX_S3WID) {
        E_ERROR("Number of words in dictionaries (%d) exceeds limit (%d)\n", n,
                MAX_S3WID);
        if (fp) fclose(fp);
        if (fp2) fclose(fp2);
        ckd_free(d);
        return NULL;
    }

    E_INFO("Allocating %d * %d bytes (%d KiB) for word entries\n",
           d->max_words, sizeof(dictword_t),
           d->max_words * sizeof(dictword_t) / 1024);
    d->word = (dictword_t *) ckd_calloc(d->max_words, sizeof(dictword_t));      /* freed in dict_free() */
    d->n_word = 0;
    if (mdef)
        d->mdef = bin_mdef_retain(mdef);

    /* Create new hash table for word strings; case-insensitive word strings */
    if (config)
        d->nocase = ps_config_bool(config, "dictcase");
    d->ht = hash_table_new(d->max_words, d->nocase);

    /* Digest main dictionary file */
    if (fp) {
        E_INFO("Reading main dictionary: %s\n", dictfile);
        dict_read(fp, d);
        fclose(fp);
        E_INFO("%d words read\n", d->n_word);
    }

    if (dict_wordid(d, S3_START_WORD) != BAD_S3WID) {
	E_ERROR("Remove sentence start word '<s>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }
    if (dict_wordid(d, S3_FINISH_WORD) != BAD_S3WID) {
	E_ERROR("Remove sentence start word '</s>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }
    if (dict_wordid(d, S3_SILENCE_WORD) != BAD_S3WID) {
	E_ERROR("Remove silence word '<sil>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }

    /* Now the filler dictionary file, if it exists */
    d->filler_start = d->n_word;
    if (fp2) {
        E_INFO("Reading filler dictionary: %s\n", fillerfile);
        dict_read(fp2, d);
        fclose(fp2);
        E_INFO("%d words read\n", d->n_word - d->filler_start);
    }
    if (mdef)
        sil = bin_mdef_silphone(mdef);
    else
        sil = 0;
    if (dict_wordid(d, S3_START_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_START_WORD, &sil, 1);
    }
    if (dict_wordid(d, S3_FINISH_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_FINISH_WORD, &sil, 1);
    }
    if (dict_wordid(d, S3_SILENCE_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_SILENCE_WORD, &sil, 1);
    }

    d->filler_end = d->n_word - 1;

    /* Initialize distinguished word-ids */
    d->startwid = dict_wordid(d, S3_START_WORD);
    d->finishwid = dict_wordid(d, S3_FINISH_WORD);
    d->silwid = dict_wordid(d, S3_SILENCE_WORD);

    if ((d->filler_start > d->filler_end)
        || (!dict_filler_word(d, d->silwid))) {
        E_ERROR("Word '%s' must occur (only) in filler dictionary\n",
                S3_SILENCE_WORD);
        dict_free(d);
        return NULL;
    }

    /* No check that alternative pronunciations for filler words are in filler range!! */

    return d;
}